

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDefaultVertexArrayObjectTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::VertexAttributeDivisorCase::iterate
          (VertexAttributeDivisorCase *this)

{
  int iVar1;
  GLenum err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_1a8;
  undefined1 local_28 [8];
  CallLogWrapper gl;
  VertexAttributeDivisorCase *this_local;
  
  gl._16_8_ = this;
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_28,(Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_1a8,(char (*) [45])"Using VertexAttribDivisor with default VAO.\n");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [20])"Expecting no error.");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_28,true);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)local_28,0);
  glu::CallLogWrapper::glVertexAttribDivisor((CallLogWrapper *)local_28,0,3);
  err = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  glu::checkError(err,"VertexAttribDivisor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDefaultVertexArrayObjectTests.cpp"
                  ,0x40);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_28);
  return STOP;
}

Assistant:

VertexAttributeDivisorCase::IterateResult VertexAttributeDivisorCase::iterate (void)
{
	glu::CallLogWrapper gl(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Using VertexAttribDivisor with default VAO.\n"
						<< "Expecting no error."
						<< tcu::TestLog::EndMessage;

	gl.enableLogging(true);
	gl.glBindVertexArray(0);

	// Using vertexAttribDivisor with default vao is not an error in ES 3.0.
	gl.glVertexAttribDivisor(0, 3);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "VertexAttribDivisor");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}